

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

Result<unsigned_int> * __thiscall
wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::getTypeIndex
          (Result<unsigned_int> *__return_storage_ptr__,
          TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *this,Name id)

{
  char **reason;
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  undefined1 local_78 [8];
  Name id_local;
  long local_58 [2];
  Err local_48;
  
  id_local.super_IString.str._M_len = id.super_IString.str._M_str;
  local_78 = id.super_IString.str._M_len;
  p_Var4 = (_Hash_node_base *)0x0;
  p_Var3 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&this->typeIndices->_M_h,
                      id_local.super_IString.str._M_len % (this->typeIndices->_M_h)._M_bucket_count,
                      (key_type *)local_78,id_local.super_IString.str._M_len);
  if (p_Var3 != (__node_base_ptr)0x0) {
    p_Var4 = p_Var3->_M_nxt;
  }
  if (p_Var4 == (_Hash_node_base *)0x0) {
    reason = &id_local.super_IString.str._M_str;
    id_local.super_IString.str._M_str = (char *)local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)reason,"unknown type identifier","");
    Lexer::err(&local_48,(Lexer *)(this + 1),(string *)reason);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err> = puVar1;
    paVar2 = &local_48.msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.msg._M_dataplus._M_p == paVar2) {
      *puVar1 = CONCAT71(local_48.msg.field_2._M_allocated_capacity._1_7_,
                         local_48.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x18) =
           local_48.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err> = local_48.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                        super__Move_assign_alias<unsigned_int,_wasm::Err>.
                        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                        super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x10) =
           CONCAT71(local_48.msg.field_2._M_allocated_capacity._1_7_,
                    local_48.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 8) =
         local_48.msg._M_string_length;
    local_48.msg._M_string_length = 0;
    local_48.msg.field_2._M_local_buf[0] = '\0';
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\x01';
    if ((long *)id_local.super_IString.str._M_str != local_58) {
      local_48.msg._M_dataplus._M_p = (pointer)paVar2;
      operator_delete(id_local.super_IString.str._M_str,local_58[0] + 1);
    }
  }
  else {
    *(undefined4 *)
     &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err> = *(undefined4 *)&p_Var4[3]._M_nxt;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Index> getTypeIndex(Name id) {
    auto it = typeIndices.find(id);
    if (it == typeIndices.end()) {
      return self().in.err("unknown type identifier");
    }
    return it->second;
  }